

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O1

bool TestEncoders(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int32_t iVar6;
  ostream *poVar7;
  size_t sVar8;
  long *plVar9;
  uint8_t uVar10;
  uint uVar11;
  int iVar12;
  int row;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  unsigned_long darray [4];
  unsigned_long testValue [4];
  char buf [250];
  long local_188 [5];
  uint local_15c;
  long local_158 [4];
  undefined1 local_138 [8];
  char acStack_130 [256];
  
  uVar11 = 0xf;
  if (qlaNum == 2) {
    uVar11 = 0xf0;
  }
  uVar13 = (uint)(qlaNum == 2) * 4;
  cVar2 = (char)logFile;
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"=== ENCODER INPUTS ===",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar17 = 0;
  Amp1394Console::Print
            (curLine,9,
             "This test uses the DOUT signals to generate a known number of quadrature encoder signals"
            );
  local_15c = uVar11;
  AmpIO::WriteDigitalOutput(Board,(uint8_t)uVar11,'3');
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)logFile,"   Preload to 0x000000: ",0x18);
  do {
    AmpIO::WriteEncoderPreload(Board,uVar13 + iVar17,0);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 4);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar3 = true;
  lVar14 = 0;
  do {
    iVar6 = AmpIO::GetEncoderPosition(Board,uVar13 | (uint)lVar14);
    local_188[lVar14] = (long)iVar6;
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    if (iVar6 != 0) {
      bVar3 = false;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"- PASS",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    local_138[0] = 'S';
    local_138[1] = 'e';
    local_138[2] = 't';
    local_138[3] = ' ';
    local_138[4] = 'e';
    local_138[5] = 'n';
    local_138[6] = 'c';
    local_138[7] = 'o';
    builtin_strncpy(acStack_130,"der preload to 0 - PASS",0x18);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"- FAIL",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    sprintf(local_138,"Set encoder preload to 0 - FAIL (%06lx %06lx %06lx %06lx)",local_188[0],
            local_188[1],local_188[2],local_188[3]);
  }
  iVar17 = curLine + 2;
  iVar12 = 0;
  Amp1394Console::Print(curLine + 1,9,local_138);
  Amp1394Console::Refresh();
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Increment to 0x000100:",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    bVar21 = false;
    Amp1394Console::Print(iVar17,9,"Testing encoder increment to 0x000100 -");
    local_158[2] = 0;
    local_158[3] = 0;
    local_158[0] = 0;
    local_158[1] = 0;
    if (bVar3) {
      bVar21 = false;
      uVar15 = 0;
      do {
        EncUp(Board,qlaNum);
        Amp1394_Sleep(0.0001);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"      ",6);
        (*Port->_vptr_BasePort[0x1d])();
        lVar14 = 0;
        do {
          iVar6 = AmpIO::GetEncoderPosition(Board,uVar13 | (uint)lVar14);
          lVar18 = (long)iVar6;
          local_188[lVar14] = lVar18;
          std::ostream::_M_insert<unsigned_long>((ulong)logFile);
          if (local_158[lVar14] + uVar15 * 4 + 4 == lVar18) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"  ",2);
          }
          else if (uVar15 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"  ",2);
            local_158[lVar14] = lVar18 + -4;
            bVar21 = true;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"* ",2);
            bVar3 = false;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        uVar1 = uVar15 + 1;
      } while ((uVar15 < 0x3f) && (uVar15 = uVar1, bVar3));
      uVar15 = (ulong)((int)uVar1 * 4 + 0x800000);
    }
    else {
      uVar15 = 0x800000;
    }
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"   Increment result - PASS",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      local_138._0_5_ = 0x53534150;
      if (bVar21) {
        sVar8 = strlen(local_138);
        *(undefined8 *)(local_138 + sVar8) = 0x7473756a64612820;
        *(undefined4 *)(local_138 + sVar8 + 7) = 0x646574;
        pcVar16 = " 1";
        lVar14 = 0;
        do {
          if (local_158[lVar14] != 0x800000) {
            strcat(local_138,pcVar16);
          }
          lVar14 = lVar14 + 1;
          pcVar16 = pcVar16 + 3;
        } while (lVar14 != 4);
        sVar8 = strlen(local_138);
        *(undefined2 *)(local_138 + sVar8) = 0x29;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"   Increment result - FAIL",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      sprintf(local_138,"FAIL at %06lx (%06lx %06lx %06lx %06lx)",uVar15,local_188[0],local_188[1],
              local_188[2],local_188[3]);
    }
    Amp1394Console::Print(iVar17,0x31,local_138);
    Amp1394Console::Refresh();
    iVar17 = curLine + 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)logFile,"   Preload to 0x000100: ",0x18);
  do {
    AmpIO::WriteEncoderPreload(Board,uVar13 + iVar12,0x100);
    iVar12 = iVar12 + 1;
  } while (iVar12 != 4);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar21 = true;
  lVar14 = 0;
  do {
    iVar6 = AmpIO::GetEncoderPosition(Board,uVar13 | (uint)lVar14);
    local_188[lVar14] = (long)iVar6;
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    if (iVar6 != 0x100) {
      bVar21 = false;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  if (bVar21) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"- PASS",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    builtin_strncpy(acStack_130 + 0x18,"- PASS",7);
    local_138[0] = 'S';
    local_138[1] = 'e';
    local_138[2] = 't';
    local_138[3] = ' ';
    local_138[4] = 'e';
    local_138[5] = 'n';
    local_138[6] = 'c';
    local_138[7] = 'o';
    builtin_strncpy(acStack_130,"der preload to 0x000100 ",0x18);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"- FAIL",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    bVar3 = false;
    sprintf(local_138,"Set encoder preload to 0x000100 - FAIL (%06lx %06lx %06lx %06lx)",
            local_188[0],local_188[1],local_188[2],local_188[3]);
  }
  row = iVar17 + 1;
  Amp1394Console::Print(iVar17,9,local_138);
  Amp1394Console::Refresh();
  iVar12 = row;
  if (bVar21) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Decrement to 0x000000:",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    bVar22 = false;
    Amp1394Console::Print(row,9,"Testing encoder decrement to 0x000000 -");
    local_158[2] = 0;
    local_158[3] = 0;
    local_158[0] = 0;
    local_158[1] = 0;
    if (bVar21) {
      lVar14 = 0x3f;
      bVar22 = false;
      do {
        EncDown(Board,qlaNum);
        Amp1394_Sleep(0.0001);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"      ",6);
        (*Port->_vptr_BasePort[0x1d])();
        lVar18 = 0;
        do {
          iVar6 = AmpIO::GetEncoderPosition(Board,uVar13 | (uint)lVar18);
          lVar19 = (long)iVar6;
          local_188[lVar18] = lVar19;
          *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
               *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::_M_insert<unsigned_long>((ulong)logFile);
          if (local_158[lVar18] + lVar14 * 4 == lVar19) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"  ",2);
          }
          else if (lVar14 == 0x3f) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"  ",2);
            local_158[lVar18] = lVar19 + -0xfc;
            bVar22 = true;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"* ",2);
            bVar21 = false;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
        std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        bVar20 = lVar14 != 0;
        lVar14 = lVar14 + -1;
      } while ((bVar20) && (bVar21));
      lVar14 = (long)((int)lVar14 * 4 + 4);
    }
    else {
      lVar14 = 0x100;
    }
    if (bVar21) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"   Decrement result - PASS",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      local_138._0_5_ = 0x53534150;
      if (bVar22) {
        sVar8 = strlen(local_138);
        *(undefined8 *)(local_138 + sVar8) = 0x7473756a64612820;
        *(undefined4 *)(local_138 + sVar8 + 7) = 0x646574;
        pcVar16 = " 1";
        lVar14 = 0;
        do {
          if (local_158[lVar14] != 0) {
            strcat(local_138,pcVar16);
          }
          lVar14 = lVar14 + 1;
          pcVar16 = pcVar16 + 3;
        } while (lVar14 != 4);
        sVar8 = strlen(local_138);
        *(undefined2 *)(local_138 + sVar8) = 0x29;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"   Decrement result - FAIL",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      bVar3 = false;
      sprintf(local_138,"FAIL at %06lx (%06lx %06lx %06lx %06lx)",lVar14,local_188[0],local_188[1],
              local_188[2],local_188[3]);
    }
    iVar12 = iVar17 + 2;
    Amp1394Console::Print(row,0x31,local_138);
    Amp1394Console::Refresh();
  }
  Amp1394Console::Print(iVar12,9,"Testing direct encoder input (A,B,I)");
  uVar10 = '\x01';
  if (qlaNum == 2) {
    uVar10 = '\x10';
  }
  AmpIO::WriteDigitalOutput(Board,uVar10,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar4 = AmpIO::GetEncoderChannelA(Board);
  uVar11 = local_15c;
  bVar5 = (byte)local_15c;
  uVar13 = local_15c & 0xff;
  bVar21 = (bVar4 & (byte)local_15c) != 0;
  if (bVar21) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Setting channel A = 0, FAIL: ",0x20);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    plVar9 = (long *)std::ostream::operator<<((ostream *)logFile,(uint)bVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    bVar3 = false;
  }
  AmpIO::WriteDigitalOutput(Board,uVar10,uVar10);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar4 = AmpIO::GetEncoderChannelA(Board);
  bVar22 = (uVar13 & ~(uint)bVar4) != 0;
  if (bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Setting channel A = 1, FAIL: ",0x20);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    plVar9 = (long *)std::ostream::operator<<((ostream *)logFile,(uint)bVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    bVar3 = false;
  }
  uVar10 = '\x02';
  if (qlaNum == 2) {
    uVar10 = ' ';
  }
  AmpIO::WriteDigitalOutput(Board,uVar10,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar4 = AmpIO::GetEncoderChannelB(Board);
  bVar20 = (bVar4 & bVar5) != 0;
  if (bVar20) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Setting channel B = 0, FAIL: ",0x20);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    plVar9 = (long *)std::ostream::operator<<((ostream *)logFile,(uint)bVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    bVar3 = false;
  }
  AmpIO::WriteDigitalOutput(Board,uVar10,uVar10);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar4 = AmpIO::GetEncoderChannelB(Board);
  bVar23 = (uVar11 & 0xff & ~(uint)bVar4) != 0;
  if (bVar23) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Setting channel B = 1, FAIL: ",0x20);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    plVar9 = (long *)std::ostream::operator<<((ostream *)logFile,(uint)bVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    bVar3 = false;
  }
  uVar10 = '\x04';
  if (qlaNum == 2) {
    uVar10 = '@';
  }
  AmpIO::WriteDigitalOutput(Board,uVar10,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar4 = AmpIO::GetEncoderIndex(Board);
  bVar24 = (bVar4 & bVar5) != 0;
  if (bVar24) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Setting index = 0, FAIL: ",0x1c);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    plVar9 = (long *)std::ostream::operator<<((ostream *)logFile,(uint)bVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    bVar3 = false;
  }
  AmpIO::WriteDigitalOutput(Board,uVar10,uVar10);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar5 = AmpIO::GetEncoderIndex(Board);
  bVar25 = (uVar11 & 0xff & ~(uint)bVar5) != 0;
  if (bVar25) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Setting index = 1, FAIL: ",0x1c);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    plVar9 = (long *)std::ostream::operator<<((ostream *)logFile,(uint)bVar5);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    bVar3 = false;
  }
  pcVar16 = "- FAIL";
  if (!bVar25 && (!bVar24 && (!bVar23 && (!bVar20 && (!bVar22 && !bVar21))))) {
    pcVar16 = "- PASS";
  }
  Amp1394Console::Print(iVar12,0x31,pcVar16);
  pcVar16 = "   Overall result: FAIL";
  if (bVar3) {
    pcVar16 = "   Overall result: PASS";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar16,0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return bVar3;
}

Assistant:

bool TestEncoders(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    int i, j;
    unsigned long darray[4];
    unsigned long testValue[4];
    char numStr[4][3] = { " 1", " 2", " 3", " 4" };
    char buf[250];
    bool pass = true;
    bool tmpFix;

    int encStart = (qlaNum == 2) ? 4 : 0;
    uint8_t enc_mask = (qlaNum == 2) ? 0xf0 : 0x0f;

    logFile << std::endl << "=== ENCODER INPUTS ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This test uses the DOUT signals to"
                           " generate a known number of quadrature encoder signals");
    Board.WriteDigitalOutput(enc_mask, 0x33);
    // First, test setting of encoder preload
    logFile << "   Preload to 0x000000: ";
    for (i = 0; i < 4; i++)
        Board.WriteEncoderPreload(encStart+i, 0);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    for (i = 0; i < 4; i++) {
        darray[i] = Board.GetEncoderPosition(encStart+i);
        logFile << std::hex << darray[i] << " ";
        if (darray[i] != 0)
            pass = false;
    }
    if (pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Set encoder preload to 0 - PASS");
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Set encoder preload to 0 - FAIL (%06lx %06lx %06lx %06lx)",
                     darray[0], darray[1], darray[2], darray[3]);
    }
    Amp1394Console::Print(curLine++, 9, buf);
    Amp1394Console::Refresh();
    if (pass) {
        logFile << "   Increment to 0x000100:" << std::endl;
        Amp1394Console::Print(curLine, 9, "Testing encoder increment to 0x000100 -");
        tmpFix = false;
        for (j = 0; j < 4; j++)
            testValue[j] = 0;
        for (i = 0; (i < (0x100/4)) && pass; i++) {
            EncUp(Board, qlaNum);
            Amp1394_Sleep(0.0001);
            logFile << "      ";
            Port->ReadAllBoards();
            for (j = 0; j < 4; j++) {
                darray[j] = Board.GetEncoderPosition(encStart+j);
                logFile << darray[j];
                unsigned long expected = testValue[j]+4*(i+1);
                if (darray[j] != expected) {
                    // There appears to be a problem, where the count
                    // is less than expected after the preload. For now,
                    // we allow this discrepancy and adjust testValue
                    // so that we can continue the test.
                    if (i == 0) {
                        logFile << "  ";
                        testValue[j] = darray[j]-4;
                        tmpFix = true;
                    }
                    else {
                        logFile << "* ";
                        pass = false;
                    }
                }
                else
                    logFile << "  ";
            }
            logFile << std::endl;
        }
        if (pass) {
            logFile << "   Increment result - PASS" << std::endl;
            sprintf(buf, "PASS");
            if (tmpFix) {
                strcat(buf, " (adjusted");
                for (j = 0; j < 4; j++) {
                    if (testValue[j] != 0x800000)
                        strcat(buf, numStr[j]);
                }
                strcat(buf, ")");
            }
        }
        else {
            logFile << "   Increment result - FAIL" << std::endl;
            // Following message could be improved to take testValue into account.
            sprintf(buf, "FAIL at %06lx (%06lx %06lx %06lx %06lx)", 0x800000UL+4*i,
                         darray[0], darray[1], darray[2], darray[3]);
        }
        Amp1394Console::Print(curLine++, 49, buf);
        Amp1394Console::Refresh();
    }
    bool tmp_pass = true;
    logFile << "   Preload to 0x000100: ";
    for (i = 0; i < 4; i++)
        Board.WriteEncoderPreload(encStart+i, 0x000100);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    for (i = 0; i < 4; i++) {
        darray[i] = Board.GetEncoderPosition(encStart+i);
        logFile << std::hex << darray[i] << " ";
        if (darray[i] != 0x000100)
            tmp_pass = false;
    }
    if (tmp_pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Set encoder preload to 0x000100 - PASS");
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Set encoder preload to 0x000100 - FAIL (%06lx %06lx %06lx %06lx)",
                      darray[0], darray[1], darray[2], darray[3]);
        pass = false;
    }
    Amp1394Console::Print(curLine++, 9, buf);
    Amp1394Console::Refresh();

    if (tmp_pass) {
        logFile << "   Decrement to 0x000000:" << std::endl;
        Amp1394Console::Print(curLine, 9, "Testing encoder decrement to 0x000000 -");
        tmpFix = false;
        for (j = 0; j < 4; j++)
            testValue[j] = 0;
        for (i = (0x100/4)-1; (i >= 0) && tmp_pass; i--) {
            EncDown(Board, qlaNum);
            Amp1394_Sleep(0.0001);
            logFile << "      ";
            Port->ReadAllBoards();
            for (j = 0; j < 4; j++) {
                darray[j] = Board.GetEncoderPosition(encStart+j);
                logFile << std::hex << darray[j];
                unsigned long expected = testValue[j] + 4*i;
                if (darray[j] != expected) {
                    // There appears to be a problem, where the count
                    // is less than expected after the preload. For now,
                    // we allow this discrepancy and adjust testValue
                    // so that we can continue the test.
                    if (i == (0x100/4)-1) {
                        logFile << "  ";
                        testValue[j] = darray[j]-0x100+4;
                        tmpFix = true;
                    }
                    else {
                        logFile << "* ";
                        tmp_pass = false;
                    }
                }
                else
                    logFile << "  ";
            }
            logFile << std::endl;
        }
        if (tmp_pass) {
            logFile << "   Decrement result - PASS" << std::endl;
            sprintf(buf, "PASS");
            if (tmpFix) {
                strcat(buf, " (adjusted");
                for (j = 0; j < 4; j++) {
                    if (testValue[j] != 0)
                        strcat(buf, numStr[j]);
                }
                strcat(buf, ")");
            }
        }
        else {
            logFile << "   Decrement result - FAIL" << std::endl;
            pass = false;
            // Following message could be improved to take testValue into account.
            sprintf(buf, "FAIL at %06lx (%06lx %06lx %06lx %06lx)", 0x000000UL+4*(i+1),
                         darray[0], darray[1], darray[2], darray[3]);
        }
        Amp1394Console::Print(curLine++, 49, buf);
        Amp1394Console::Refresh();
    }

    Amp1394Console::Print(curLine, 9, "Testing direct encoder input (A,B,I)");
    bool directPass = true;

    // Test A channel directly
    uint8_t chanA;
    uint8_t dout_mask = (qlaNum == 2) ? 0x10 : 0x01;
    // Channel A low
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanA = Board.GetEncoderChannelA();
    if ((chanA&enc_mask) != 0x00) {
        logFile << "   Setting channel A = 0, FAIL: " << std::hex << (int)chanA << std::endl;
        directPass = false;
        pass = false;
    }
    // Channel A high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanA = Board.GetEncoderChannelA();
    if ((chanA&enc_mask) != enc_mask) {
        logFile << "   Setting channel A = 1, FAIL: " << std::hex << (int)chanA << std::endl;
        directPass = false;
        pass = false;
    }

    // Test B channel directly
    uint8_t chanB;
    dout_mask = (qlaNum == 2) ? 0x20 : 0x02;
    // Channel B low
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanB = Board.GetEncoderChannelB();
    if ((chanB&enc_mask) != 0x00) {
        logFile << "   Setting channel B = 0, FAIL: " << std::hex << (int)chanB << std::endl;
        directPass = false;
        pass = false;
    }
    // Channel B high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanB = Board.GetEncoderChannelB();
    if ((chanB&enc_mask) != enc_mask) {
        logFile << "   Setting channel B = 1, FAIL: " << std::hex << (int)chanB << std::endl;
        directPass = false;
        pass = false;
    }

    // Test index
    // Index low
    uint8_t index;
    dout_mask = (qlaNum == 2) ? 0x40 : 0x04;
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    index = Board.GetEncoderIndex();
    if ((index&enc_mask) != 0x00) {
        logFile << "   Setting index = 0, FAIL: " << std::hex << (int)index << std::endl;
        directPass = false;
        pass = false;
    }
    // Index high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    index = Board.GetEncoderIndex();
    if ((index&enc_mask) != enc_mask) {
        logFile << "   Setting index = 1, FAIL: " << std::hex << (int)index << std::endl;
        directPass = false;
        pass = false;
    }

    if (directPass)
        Amp1394Console::Print(curLine++, 49, "- PASS");
    else
        Amp1394Console::Print(curLine++, 49, "- FAIL");

    if (pass)
        logFile << "   Overall result: PASS" << std::endl;
    else
        logFile << "   Overall result: FAIL" << std::endl;
    return pass;
}